

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O3

void handle_write(cio_io_stream *io_stream,void *handler_context,cio_write_buffer *buffer,
                 cio_error err,size_t bytes_transferred)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  int iVar5;
  long *plVar6;
  ulong uVar7;
  long *plVar8;
  ulong *puVar9;
  
  plVar8 = (long *)((long)handler_context + 0x50);
  if (err == CIO_SUCCESS) {
    plVar6 = (long *)*plVar8;
    if (plVar6 == (long *)0x0 || plVar6 == plVar8) {
LAB_0010b724:
      if (plVar6 == plVar8) {
        (**(code **)((long)handler_context + 0x38))
                  (handler_context,*(undefined8 *)((long)handler_context + 0x40),0);
        return;
      }
    }
    else {
      *(long *)((long)handler_context + 0x60) = *(long *)((long)handler_context + 0x60) + -1;
      *(long *)((long)handler_context + 0x68) = *(long *)((long)handler_context + 0x68) - plVar6[3];
      lVar1 = *plVar6;
      plVar2 = (long *)plVar6[1];
      *(long **)(lVar1 + 8) = plVar2;
      *plVar2 = lVar1;
      plVar2 = (long *)((long)handler_context + 0x70);
      while( true ) {
        puVar9 = (ulong *)(plVar6 + 3);
        uVar7 = plVar6[3];
        if (bytes_transferred < uVar7) break;
        if (plVar2 != plVar6) {
          lVar1 = *(long *)((long)handler_context + 0x48);
          puVar3 = *(undefined8 **)(lVar1 + 8);
          *plVar6 = lVar1;
          plVar6[1] = (long)puVar3;
          *puVar3 = plVar6;
          *(long **)(lVar1 + 8) = plVar6;
          *(long *)(lVar1 + 0x10) = *(long *)(lVar1 + 0x10) + 1;
          *(long *)(lVar1 + 0x18) = *(long *)(lVar1 + 0x18) + *puVar9;
        }
        plVar6 = (long *)*plVar8;
        if ((plVar6 == plVar8) || (plVar6 == (long *)0x0)) goto LAB_0010b724;
        *(long *)((long)handler_context + 0x60) = *(long *)((long)handler_context + 0x60) + -1;
        *(long *)((long)handler_context + 0x68) =
             *(long *)((long)handler_context + 0x68) - plVar6[3];
        bytes_transferred = bytes_transferred - uVar7;
        lVar1 = *plVar6;
        plVar4 = (long *)plVar6[1];
        *(long **)(lVar1 + 8) = plVar4;
        *plVar4 = lVar1;
      }
      if (plVar2 != plVar6) {
        lVar1 = *(long *)((long)handler_context + 0x48);
        puVar3 = *(undefined8 **)(lVar1 + 8);
        *plVar6 = lVar1;
        plVar6[1] = (long)puVar3;
        *puVar3 = plVar6;
        *(long **)(lVar1 + 8) = plVar6;
        *(long *)(lVar1 + 0x10) = *(long *)(lVar1 + 0x10) + 1;
        *(long *)(lVar1 + 0x18) = *(long *)(lVar1 + 0x18) + *puVar9;
        uVar7 = *puVar9;
      }
      *(size_t *)((long)handler_context + 0x80) = bytes_transferred + plVar6[2];
      *(ulong *)((long)handler_context + 0x88) = uVar7 - bytes_transferred;
      lVar1 = *(long *)((long)handler_context + 0x50);
      *(long *)((long)handler_context + 0x70) = lVar1;
      *(long **)((long)handler_context + 0x78) = plVar8;
      *(long **)((long)handler_context + 0x50) = plVar2;
      *(long **)(lVar1 + 8) = plVar2;
      *(long *)((long)handler_context + 0x60) = *(long *)((long)handler_context + 0x60) + 1;
      *(long *)((long)handler_context + 0x68) =
           *(long *)((long)handler_context + 0x88) + *(long *)((long)handler_context + 0x68);
    }
    iVar5 = (**(code **)(*handler_context + 8))(io_stream,plVar8,handle_write,handler_context);
    if (iVar5 != 0) {
      (**(code **)((long)handler_context + 0x38))
                (handler_context,*(undefined8 *)((long)handler_context + 0x40),iVar5,
                 *(code **)((long)handler_context + 0x38));
      return;
    }
  }
  else {
    handle_write_cold_1();
  }
  return;
}

Assistant:

static void handle_write(struct cio_io_stream *io_stream, void *handler_context, struct cio_write_buffer *buffer, enum cio_error err, size_t bytes_transferred)
{
	(void)buffer;

	struct cio_buffered_stream *buffered_stream = handler_context;
	if (cio_unlikely(err != CIO_SUCCESS)) {
		struct cio_write_buffer *write_buffer = cio_write_buffer_queue_dequeue(&buffered_stream->wbh);
		while (write_buffer != NULL) {
			if (!buffer_is_temp_buffer(buffered_stream, write_buffer)) {
				cio_write_buffer_queue_tail(buffered_stream->original_wbh, write_buffer);
			}
			write_buffer = cio_write_buffer_queue_dequeue(&buffered_stream->wbh);
		}

		buffered_stream->write_handler(buffered_stream, buffered_stream->write_handler_context, err);
		return;
	}

	struct cio_write_buffer *write_buffer = cio_write_buffer_queue_dequeue(&buffered_stream->wbh);
	while (write_buffer != NULL) {
		if (buffer_partially_written(write_buffer, bytes_transferred)) {
			if (!buffer_is_temp_buffer(buffered_stream, write_buffer)) {
				cio_write_buffer_queue_tail(buffered_stream->original_wbh, write_buffer);
			}

			const void *new_data = &((const uint8_t *)write_buffer->data.element.const_data)[bytes_transferred];
			size_t new_length = write_buffer->data.element.length - bytes_transferred;
			cio_write_buffer_const_element_init(&buffered_stream->write_buffer, new_data, new_length);
			cio_write_buffer_queue_head(&buffered_stream->wbh, &buffered_stream->write_buffer);
			break;
		}

		bytes_transferred -= write_buffer->data.element.length;
		if (!buffer_is_temp_buffer(buffered_stream, write_buffer)) {
			cio_write_buffer_queue_tail(buffered_stream->original_wbh, write_buffer);
		}

		write_buffer = cio_write_buffer_queue_dequeue(&buffered_stream->wbh);
	}

	if (cio_write_buffer_queue_empty(&buffered_stream->wbh)) {
		buffered_stream->write_handler(buffered_stream, buffered_stream->write_handler_context, CIO_SUCCESS);
	} else {
		err = buffered_stream->stream->write_some(io_stream, &buffered_stream->wbh, handle_write, buffered_stream);
		if (cio_unlikely(err != CIO_SUCCESS)) {
			buffered_stream->write_handler(buffered_stream, buffered_stream->write_handler_context, err);
		}
	}
}